

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

bool DoRadiusGive(AActor *self,AActor *thing,PClassActor *item,int amount,double distance,int flags,
                 PClassActor *filter,FName *species,double mindist)

{
  PClassActor *pPVar1;
  PClassActor *pPVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  AActor *pAVar6;
  AInventory *this;
  double dVar7;
  byte local_f3;
  byte local_f2;
  byte local_f1;
  AInventory *gift;
  double lengthsquared;
  double dz;
  double dy;
  double dx;
  DVector3 diff;
  FName local_78;
  bool ptrPass;
  bool tracerPass;
  bool masterPass;
  bool targetPass;
  TFlags<ActorFlag6,_unsigned_int> local_70;
  bool speciespass;
  bool filterpass;
  TFlags<ActorFlag3,_unsigned_int> local_68;
  TFlags<ActorFlag3,_unsigned_int> local_64;
  TFlags<ActorFlag6,_unsigned_int> local_60;
  TFlags<ActorFlag,_unsigned_int> local_5c;
  TFlags<ActorFlag,_unsigned_int> local_58;
  byte local_51;
  double dStack_50;
  bool doPass;
  double mindist_local;
  PClassActor *filter_local;
  double dStack_38;
  int flags_local;
  double distance_local;
  PClassActor *pPStack_28;
  int amount_local;
  PClassActor *item_local;
  AActor *thing_local;
  AActor *self_local;
  
  local_51 = 0;
  dStack_50 = mindist;
  mindist_local = (double)filter;
  filter_local._4_4_ = flags;
  dStack_38 = distance;
  distance_local._4_4_ = amount;
  pPStack_28 = item;
  item_local = (PClassActor *)thing;
  thing_local = self;
  if (thing == self) {
    if ((flags & 1U) == 0) {
      return false;
    }
    local_51 = 1;
  }
  else {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_58,
               (int)thing +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
    if (uVar5 == 0) {
      if ((filter_local._4_4_ & 0x2000) == 0) {
LAB_0052d58b:
        if ((filter_local._4_4_ & 0x20) != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_5c,
                     (int)item_local +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
          bVar4 = true;
          if (uVar5 != 0) goto LAB_0052d617;
        }
        bVar4 = false;
        if ((filter_local._4_4_ & 0x4000) != 0) {
          TFlags<ActorFlag6,_unsigned_int>::operator&
                    (&local_60,
                     (int)item_local +
                     (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
          uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
          bVar4 = uVar5 != 0;
        }
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)item_local,AInventory::RegistrationInfo.MyClass);
        bVar4 = true;
        if (!bVar3) goto LAB_0052d58b;
      }
LAB_0052d617:
      if (bVar4) {
        local_51 = 1;
      }
      else if ((((filter_local._4_4_ & 0x1e) != 0) && ((local_51 & 1) == 0)) &&
              (0 < *(int *)((long)&item_local[1].super_PClass.super_PNativeStruct.super_PStruct.
                                   super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
                                   super_DObject.Class + 4))) {
        if (item_local[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
            super_PCompoundType.super_PType.Symbols.Symbols.Nodes == (Node *)0x0) {
          if ((filter_local._4_4_ & 4) == 0) {
LAB_0052d6eb:
            bVar4 = false;
            if ((filter_local._4_4_ & 8) != 0) {
              TFlags<ActorFlag3,_unsigned_int>::operator&
                        (&local_68,
                         (int)item_local +
                         (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
              uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_68);
              bVar4 = false;
              if (uVar5 == 0) {
                TFlags<ActorFlag,_unsigned_int>::operator&
                          ((TFlags<ActorFlag,_unsigned_int> *)&stack0xffffffffffffff94,
                           (int)item_local +
                           (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
                uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xffffffffffffff94);
                bVar4 = true;
                if (uVar5 == 0) {
                  TFlags<ActorFlag6,_unsigned_int>::operator&
                            (&local_70,
                             (int)item_local +
                             (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
                  uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
                  bVar4 = uVar5 != 0;
                }
              }
            }
          }
          else {
            TFlags<ActorFlag3,_unsigned_int>::operator&
                      (&local_64,
                       (int)item_local +
                       (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
            uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
            bVar4 = true;
            if (uVar5 == 0) goto LAB_0052d6eb;
          }
          if (bVar4) {
            local_51 = 1;
          }
        }
        else if ((((filter_local._4_4_ & 2) != 0) &&
                 ((PClassActor *)
                  (item_local[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.Symbols.Symbols.Nodes)->Next == item_local)) ||
                (((filter_local._4_4_ & 0x10) != 0 &&
                 ((PClassActor *)
                  (item_local[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.Symbols.Symbols.Nodes)->Next != item_local)))) {
          local_51 = 1;
        }
      }
    }
    else {
      if ((filter_local._4_4_ & 0x800) == 0) {
        return false;
      }
      local_51 = 1;
    }
  }
  if ((local_51 & 1) == 0) {
    return false;
  }
  targetPass = DoCheckClass((AActor *)item_local,(PClassActor *)mindist_local,
                            (filter_local._4_4_ & 0x8000) != 0);
  pPVar1 = item_local;
  FName::FName(&local_78,species);
  masterPass = DoCheckSpecies((AActor *)pPVar1,&local_78,(filter_local._4_4_ & 0x10000) != 0);
  pPVar1 = item_local;
  if ((filter_local._4_4_ & 0x20000) == 0) {
    if ((targetPass & 1U) != 0) goto joined_r0x0052d86c;
  }
  else {
    if ((targetPass & 1U) != 0) goto LAB_0052d883;
joined_r0x0052d86c:
    if (masterPass) goto LAB_0052d883;
  }
  if ((AActor *)item_local != thing_local) {
    return false;
  }
LAB_0052d883:
  if (((AActor *)item_local != thing_local) && ((filter_local._4_4_ & 0x1c0) != 0)) {
    diff.Z._7_1_ = 1;
    diff.Z._6_1_ = 1;
    diff.Z._5_1_ = 1;
    diff.Z._4_1_ = 0;
    pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&thing_local->target);
    pPVar2 = item_local;
    if (((AActor *)pPVar1 == pAVar6) && ((filter_local._4_4_ & 0x40) != 0)) {
      diff.Z._7_1_ = 0;
    }
    pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&thing_local->master);
    pPVar1 = item_local;
    if (((AActor *)pPVar2 == pAVar6) && ((filter_local._4_4_ & 0x100) != 0)) {
      diff.Z._6_1_ = 0;
    }
    pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&thing_local->tracer);
    if (((AActor *)pPVar1 == pAVar6) && ((filter_local._4_4_ & 0x80) != 0)) {
      diff.Z._5_1_ = 0;
    }
    if ((filter_local._4_4_ & 0x1000) == 0) {
      local_f3 = 0;
      if (((diff.Z._7_1_ & 1) != 0) && (local_f3 = 0, (diff.Z._6_1_ & 1) != 0)) {
        local_f3 = diff.Z._5_1_;
      }
      local_f2 = local_f3;
    }
    else {
      local_f1 = 1;
      if (((diff.Z._7_1_ & 1) == 0) && (local_f1 = 1, (diff.Z._6_1_ & 1) == 0)) {
        local_f1 = diff.Z._5_1_;
      }
      local_f2 = local_f1;
    }
    diff.Z._4_1_ = local_f2 & 1;
    if (diff.Z._4_1_ == 0) {
      return false;
    }
  }
  if ((local_51 & 1) != 0) {
    AActor::Vec3To((DVector3 *)&dx,thing_local,(AActor *)item_local);
    diff.Y = *(double *)&item_local->BloodColor * 0.5 + diff.Y;
    if ((filter_local._4_4_ & 0x200) == 0) {
      dVar7 = TVector3<double>::LengthSquared((TVector3<double> *)&dx);
      if ((dStack_38 * dStack_38 < dVar7) ||
         (((dStack_50 != 0.0 || (NAN(dStack_50))) && (dVar7 < dStack_50 * dStack_50)))) {
        return false;
      }
    }
    else if ((((dStack_38 < ABS(dx)) || (dStack_38 < ABS(diff.X))) || (dStack_38 < ABS(diff.Y))) ||
            (((dStack_50 != 0.0 || (NAN(dStack_50))) &&
             ((ABS(dx) < dStack_50 && ((ABS(diff.X) < dStack_50 && (ABS(diff.Y) < dStack_50))))))))
    {
      return false;
    }
    if (((filter_local._4_4_ & 0x400) != 0) ||
       (bVar4 = P_CheckSight((AActor *)item_local,thing_local,9), bVar4)) {
      this = (AInventory *)Spawn(pPStack_28);
      bVar4 = DObject::IsKindOf((DObject *)this,AHealth::RegistrationInfo.MyClass);
      if (bVar4) {
        this->Amount = distance_local._4_4_ * this->Amount;
      }
      else {
        this->Amount = distance_local._4_4_;
      }
      TFlags<ActorFlag,_unsigned_int>::operator|=(&(this->super_AActor).flags,MF_DROPPED);
      AActor::ClearCounters((AActor *)this);
      bVar4 = AInventory::CallTryPickup(this,(AActor *)item_local,(AActor **)0x0);
      if (!bVar4) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool DoRadiusGive(AActor *self, AActor *thing, PClassActor *item, int amount, double distance, int flags, PClassActor *filter, FName species, double mindist)
{
	
	bool doPass = false;
	// Always allow self to give, no matter what other flags are specified. Otherwise, not at all.
	if (thing == self)
	{
		if (!(flags & RGF_GIVESELF))
			return false;
		doPass = true;
	}
	else if (thing->flags & MF_MISSILE)
	{
		if (!(flags & RGF_MISSILES))
			return false;
		doPass = true;
	}
	else if (((flags & RGF_ITEMS) && thing->IsKindOf(RUNTIME_CLASS(AInventory))) ||
			((flags & RGF_CORPSES) && thing->flags & MF_CORPSE) ||
			((flags & RGF_KILLED) && thing->flags6 & MF6_KILLED))
	{
		doPass = true;
	}
	else if ((flags & (RGF_MONSTERS | RGF_OBJECTS | RGF_PLAYERS | RGF_VOODOO)))
	{
		// Make sure it's alive as we're not looking for corpses or killed here.
		if (!doPass && thing->health > 0)
		{
			if (thing->player != nullptr)
			{
				if (((flags & RGF_PLAYERS) && (thing->player->mo == thing)) ||
					((flags & RGF_VOODOO) && (thing->player->mo != thing)))
				{
					doPass = true;
				}
			}
			else
			{
				if (((flags & RGF_MONSTERS) && (thing->flags3 & MF3_ISMONSTER)) ||
					((flags & RGF_OBJECTS) && (!(thing->flags3 & MF3_ISMONSTER)) &&
					(thing->flags & MF_SHOOTABLE || thing->flags6 & MF6_VULNERABLE)))
				{
					doPass = true;
				}
			}
		}
	}

	// Nothing matched up so don't bother with the rest.
	if (!doPass)
		return false;

	//[MC] Check for a filter, species, and the related exfilter/expecies/either flag(s).
	bool filterpass = DoCheckClass(thing, filter, !!(flags & RGF_EXFILTER)),
		speciespass = DoCheckSpecies(thing, species, !!(flags & RGF_EXSPECIES));

	if ((flags & RGF_EITHER) ? (!(filterpass || speciespass)) : (!(filterpass && speciespass)))
	{
		if (thing != self)      //Don't let filter and species obstruct RGF_GIVESELF.
			return false;
	}

	if ((thing != self) && (flags & (RGF_NOTARGET | RGF_NOMASTER | RGF_NOTRACER)))
	{
		//Check for target, master, and tracer flagging.
		bool targetPass = true;
		bool masterPass = true;
		bool tracerPass = true;
		bool ptrPass = false;

		if ((thing == self->target) && (flags & RGF_NOTARGET))
			targetPass = false;
		if ((thing == self->master) && (flags & RGF_NOMASTER))
			masterPass = false;
		if ((thing == self->tracer) && (flags & RGF_NOTRACER))
			tracerPass = false;

		ptrPass = (flags & RGF_INCLUSIVE) ? (targetPass || masterPass || tracerPass) : (targetPass && masterPass && tracerPass);

		//We should not care about what the actor is here. It's safe to abort this actor.
		if (!ptrPass)
			return false;
	}

	if (doPass)
	{
		DVector3 diff = self->Vec3To(thing);
		diff.Z += thing->Height *0.5;
		if (flags & RGF_CUBE)
		{ // check if inside a cube
			double dx = fabs(diff.X);
			double dy = fabs(diff.Y);
			double dz = fabs(diff.Z);
			if ((dx > distance || dy > distance || dz > distance) || (mindist && (dx < mindist && dy < mindist && dz < mindist)))
			{
				return false;
			}
		}
		else
		{ // check if inside a sphere
			double lengthsquared = diff.LengthSquared();
			if (lengthsquared > distance*distance || (mindist && (lengthsquared < mindist*mindist)))
			{
				return false;
			}
		}

		if ((flags & RGF_NOSIGHT) || P_CheckSight(thing, self, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY))
		{ // OK to give; target is in direct path, or the monster doesn't care about it being in line of sight.
			AInventory *gift = static_cast<AInventory *>(Spawn(item));
			if (gift->IsKindOf(RUNTIME_CLASS(AHealth)))
			{
				gift->Amount *= amount;
			}
			else
			{
				gift->Amount = amount;
			}
			gift->flags |= MF_DROPPED;
			gift->ClearCounters();
			if (!gift->CallTryPickup(thing))
			{
				gift->Destroy();
				return false;
			}
			else
			{
				return true;
			}
		}
	}
	return false;
}